

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslationalOrderParamZ.cpp
# Opt level: O1

void __thiscall
OpenMD::TranslationalOrderParamZ::collectHistogram
          (TranslationalOrderParamZ *this,StuntDouble *sd1,StuntDouble *sd2)

{
  int *piVar1;
  double dVar2;
  char cVar3;
  uint i_3;
  uint i_2;
  Vector3d *pVVar4;
  long lVar5;
  double tmp;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Vector<double,_3U> result;
  Vector3d pos2;
  Vector3d pos1;
  Vector3d r12;
  double local_98 [4];
  Vector3d local_78;
  Vector3d local_58;
  Vector3d local_38;
  double local_18;
  undefined8 uStack_10;
  
  if (sd1 != sd2) {
    cVar3 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    local_18 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
    uStack_10 = 0;
    pVVar4 = (Vector3d *)
             ((long)sd1->localIndex_ * 0x18 +
             *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + sd1->storage_));
    local_58.super_Vector<double,_3U>.data_[0] = 0.0;
    local_58.super_Vector<double,_3U>.data_[1] = 0.0;
    local_58.super_Vector<double,_3U>.data_[2] = 0.0;
    if (pVVar4 != &local_58) {
      lVar5 = 0;
      do {
        local_58.super_Vector<double,_3U>.data_[lVar5] =
             (pVVar4->super_Vector<double,_3U>).data_[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
    }
    pVVar4 = (Vector3d *)
             ((long)sd2->localIndex_ * 0x18 +
             *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + sd2->storage_));
    local_78.super_Vector<double,_3U>.data_[0] = 0.0;
    local_78.super_Vector<double,_3U>.data_[1] = 0.0;
    local_78.super_Vector<double,_3U>.data_[2] = 0.0;
    if (pVVar4 != &local_78) {
      lVar5 = 0;
      do {
        local_78.super_Vector<double,_3U>.data_[lVar5] =
             (pVVar4->super_Vector<double,_3U>).data_[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
    }
    local_98[0] = 0.0;
    local_98[1] = 0.0;
    local_98[2] = 0.0;
    lVar5 = 0;
    do {
      local_98[lVar5] =
           local_78.super_Vector<double,_3U>.data_[lVar5] -
           local_58.super_Vector<double,_3U>.data_[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    local_38.super_Vector<double,_3U>.data_[2] = local_98[2];
    local_38.super_Vector<double,_3U>.data_[0] = local_98[0];
    local_38.super_Vector<double,_3U>.data_[1] = local_98[1];
    if (cVar3 != '\0') {
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,&local_38);
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,&local_58);
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,&local_78);
    }
    dVar6 = 0.0;
    lVar5 = 0;
    do {
      dVar2 = local_38.super_Vector<double,_3U>.data_[lVar5];
      dVar6 = dVar6 + dVar2 * dVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    if (dVar6 < this->len_) {
      lVar5 = *(long *)&(this->histogram_).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)(dVar6 / this->deltaR_)].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      auVar7._0_8_ = (double)this->nZBins_ *
                     (local_18 * 0.5 + local_58.super_Vector<double,_3U>.data_[(uint)this->axis_]);
      auVar7._8_8_ = (double)this->nZBins_ *
                     (local_18 * 0.5 + local_78.super_Vector<double,_3U>.data_[(uint)this->axis_]);
      auVar8._8_8_ = local_18;
      auVar8._0_8_ = local_18;
      auVar8 = divpd(auVar7,auVar8);
      piVar1 = (int *)(lVar5 + (long)(int)auVar8._0_8_ * 4);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)(lVar5 + (long)(int)auVar8._8_8_ * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void TranslationalOrderParamZ::collectHistogram(StuntDouble* sd1,
                                                  StuntDouble* sd2) {
    if (sd1 == sd2) { return; }

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();
    RealType boxZ = zBox_.back();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) {
      currentSnapshot_->wrapVector(r12);
      currentSnapshot_->wrapVector(pos1);
      currentSnapshot_->wrapVector(pos2);
    }

    RealType distance = r12.length();

    if (distance < len_) {
      int whichBin = int(distance / deltaR_);
      int zBin1    = int(nZBins_ * (0.5 * boxZ + pos1[axis_]) / boxZ);
      int zBin2    = int(nZBins_ * (0.5 * boxZ + pos2[axis_]) / boxZ);

      histogram_[whichBin][zBin1] += 1;
      histogram_[whichBin][zBin2] += 1;
    }
  }